

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::applyTabooVariableIn
          (HEkk *this,vector<double,_std::allocator<double>_> *values,double overwrite_with)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  value_type in_XMM0_Qa;
  HighsInt iCol;
  HighsInt iX;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    sVar3 = std::
            vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
            ::size((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                    *)(in_RDI + 0x3880));
    if ((int)sVar3 <= local_1c) break;
    pvVar4 = std::
             vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                           *)(in_RDI + 0x3880),(long)local_1c);
    if ((pvVar4->taboo & 1U) != 0) {
      pvVar4 = std::
               vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
               ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                             *)(in_RDI + 0x3880),(long)local_1c);
      iVar2 = pvVar4->variable_in;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar2);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
               ::operator[]((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                             *)(in_RDI + 0x3880),(long)local_1c);
      pvVar4->save_value = vVar1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar2);
      *pvVar5 = in_XMM0_Qa;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void HEkk::applyTabooVariableIn(vector<double>& values,
                                const double overwrite_with) {
  assert((HighsInt)values.size() >= lp_.num_col_ + lp_.num_row_);
  for (HighsInt iX = 0; iX < (HighsInt)bad_basis_change_.size(); iX++) {
    if (bad_basis_change_[iX].taboo) {
      HighsInt iCol = bad_basis_change_[iX].variable_in;
      bad_basis_change_[iX].save_value = values[iCol];
      values[iCol] = overwrite_with;
    }
  }
}